

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O2

void __thiscall
pbrt::Array2D<float>::Array2D<float_const*,void>
          (Array2D<float> *this,float *first,float *last,int nx,int ny,allocator_type allocator)

{
  ulong uVar1;
  ulong uVar2;
  Bounds2i local_28;
  
  local_28.pMin.super_Tuple2<pbrt::Point2,_int>.x = nx >> 0x1f & nx;
  local_28.pMin.super_Tuple2<pbrt::Point2,_int>.y = ny >> 0x1f & ny;
  uVar2 = 0;
  uVar1 = (ulong)(uint)nx;
  if (nx < 1) {
    uVar1 = uVar2;
  }
  if (0 < ny) {
    uVar2 = (ulong)(uint)ny;
  }
  local_28.pMax.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)(uVar1 | uVar2 << 0x20)
  ;
  Array2D(this,&local_28,(Allocator)allocator.memoryResource);
  if ((long)last - (long)first != 0) {
    memmove(this->values,first,(long)last - (long)first);
  }
  return;
}

Assistant:

Array2D(InputIt first, InputIt last, int nx, int ny, allocator_type allocator = {})
        : Array2D({{0, 0}, {nx, ny}}, allocator) {
        std::copy(first, last, begin());
    }